

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_device_write_to_stream__pulse
                    (ma_device *pDevice,ma_pa_stream *pStream,ma_uint64 *pFramesProcessed)

{
  ma_device_state mVar1;
  undefined1 auVar2 [16];
  wchar_t result;
  ma_result mVar3;
  ma_uint64 frameCount;
  uint uVar4;
  size_t bytesMapped;
  void *pMappedPCMFrames;
  
  if (pStream == (ma_pa_stream *)0x0) {
    __assert_fail("pStream != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/RobLoach[P]raylib-cpp/build_O2/_deps/raylib-src/src/external/miniaudio.h"
                  ,0x75ae,
                  "ma_result ma_device_write_to_stream__pulse(ma_device *, ma_pa_stream *, ma_uint64 *)"
                 );
  }
  uVar4 = *(int *)(&DAT_001b1b40 + (ulong)(pDevice->playback).internalFormat * 4) *
          (pDevice->playback).internalChannels;
  if (uVar4 == 0) {
    __assert_fail("bpf > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/RobLoach[P]raylib-cpp/build_O2/_deps/raylib-src/src/external/miniaudio.h"
                  ,0x75b1,
                  "ma_result ma_device_write_to_stream__pulse(ma_device *, ma_pa_stream *, ma_uint64 *)"
                 );
  }
  mVar1 = (pDevice->state).value;
  bytesMapped = (*(pDevice->pContext->field_14).alsa.snd_pcm_info)(pStream);
  if (bytesMapped == 0xffffffffffffffff) {
    mVar3 = MA_ERROR;
  }
  else {
    if (bytesMapped == 0) {
      mVar3 = MA_SUCCESS;
      frameCount = 0;
      goto LAB_0013b886;
    }
    result = (*(pDevice->pContext->field_14).alsa.snd_pcm_avail)
                       (pStream,&pMappedPCMFrames,&bytesMapped);
    if (L'\xffffffff' < result) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = bytesMapped;
      auVar2 = auVar2 / ZEXT416(uVar4);
      frameCount = auVar2._0_8_;
      if ((mVar1 & ~ma_device_state_stopped) == ma_device_state_started) {
        ma_device_handle_backend_data_callback(pDevice,pMappedPCMFrames,(void *)0x0,auVar2._0_4_);
      }
      else {
        ma_silence_pcm_frames
                  (pMappedPCMFrames,frameCount,(pDevice->playback).format,
                   (pDevice->playback).channels);
      }
      mVar3 = MA_SUCCESS;
      result = (*(pDevice->pContext->field_14).alsa.snd_pcm_avail_update)
                         (pStream,pMappedPCMFrames,bytesMapped,0,0,0);
      if (L'\xffffffff' < result) goto LAB_0013b886;
    }
    mVar3 = ma_result_from_pulse(result);
  }
  frameCount = 0;
LAB_0013b886:
  if (pFramesProcessed != (ma_uint64 *)0x0) {
    *pFramesProcessed = frameCount;
  }
  return mVar3;
}

Assistant:

static ma_result ma_device_write_to_stream__pulse(ma_device* pDevice, ma_pa_stream* pStream, ma_uint64* pFramesProcessed)
{
    ma_result result = MA_SUCCESS;
    ma_uint64 framesProcessed = 0;
    size_t bytesMapped;
    ma_uint32 bpf;
    ma_uint32 deviceState;

    MA_ASSERT(pDevice != NULL);
    MA_ASSERT(pStream != NULL);

    bpf = ma_get_bytes_per_frame(pDevice->playback.internalFormat, pDevice->playback.internalChannels);
    MA_ASSERT(bpf > 0);

    deviceState = ma_device_get_state(pDevice);

    bytesMapped = ((ma_pa_stream_writable_size_proc)pDevice->pContext->pulse.pa_stream_writable_size)(pStream);
    if (bytesMapped != (size_t)-1) {
        if (bytesMapped > 0) {
            ma_uint64 framesMapped;
            void* pMappedPCMFrames;
            int pulseResult = ((ma_pa_stream_begin_write_proc)pDevice->pContext->pulse.pa_stream_begin_write)(pStream, &pMappedPCMFrames, &bytesMapped);
            if (pulseResult < 0) {
                result = ma_result_from_pulse(pulseResult);
                goto done;
            }

            framesMapped = bytesMapped / bpf;

            if (deviceState == ma_device_state_started || deviceState == ma_device_state_starting) {  /* Check for starting state just in case this is being used to do the initial fill. */
                ma_device_handle_backend_data_callback(pDevice, pMappedPCMFrames, NULL, framesMapped);
            } else {
                /* Device is not started. Write silence. */
                ma_silence_pcm_frames(pMappedPCMFrames, framesMapped, pDevice->playback.format, pDevice->playback.channels);
            }

            pulseResult = ((ma_pa_stream_write_proc)pDevice->pContext->pulse.pa_stream_write)(pStream, pMappedPCMFrames, bytesMapped, NULL, 0, MA_PA_SEEK_RELATIVE);
            if (pulseResult < 0) {
                result = ma_result_from_pulse(pulseResult);
                goto done;  /* Failed to write data to stream. */
            }

            framesProcessed += framesMapped;
        } else {
            result = MA_SUCCESS;  /* No data available for writing. */
            goto done;
        }
    } else {
        result = MA_ERROR;  /* Failed to retrieve the writable size. Abort. */
        goto done;
    }

done:
    if (pFramesProcessed != NULL) {
        *pFramesProcessed = framesProcessed;
    }

    return result;
}